

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Class_AST_Node::eval_internal(Class_AST_Node *this,Dispatch_State *t_ss)

{
  element_type *peVar1;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  Scope_Push_Pop spp;
  Scope_Push_Pop local_68;
  Boxed_Value local_60;
  string local_50;
  element_type *local_28;
  
  chaiscript::detail::Dispatch_Engine::new_scope
            ((in_RDX->m_engine)._M_data,(in_RDX->m_stack_holder)._M_data);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_current_class_name","");
  chaiscript::detail::const_var_impl<std::__cxx11::string>
            ((detail *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align
             + 0x20));
  chaiscript::detail::Dispatch_State::add_object(in_RDX,&local_50,&local_60);
  if (local_60.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffd0,
                 *(Dispatch_State **)
                  ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                          _M_mutex + 0x10));
  if (local_28 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  (this->super_AST_Node)._vptr_AST_Node = (_func_int **)0x0;
  peVar1 = (element_type *)operator_new(0x50);
  (peVar1->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar1->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
  (peVar1->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&peVar1->identifier = 0;
  *(undefined4 *)&(peVar1->text)._M_dataplus._M_p = 0x20;
  (peVar1->text)._M_string_length = 0;
  (peVar1->text).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(peVar1->text).field_2 + 8) = 0;
  (peVar1->location).start.line = 0;
  (peVar1->location).start.column = 0;
  *(undefined2 *)&(peVar1->location).end.line = 0;
  (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
  super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_AST_Node)._vptr_AST_Node =
       (_func_int **)
       &(peVar1->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
        super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  detail::Scope_Push_Pop::~Scope_Push_Pop(&local_68);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          /// \todo do this better
          // put class name in current scope so it can be looked up by the attrs and methods
          t_ss.add_object("_current_class_name", const_var(children[0]->text));

          children[1]->eval(t_ss);

          return Boxed_Value();
        }